

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O0

void __thiscall
ExchangeCompilation_MissingTriple_Test::TestBody(ExchangeCompilation_MissingTriple_Test *this)

{
  bool bVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  error_code *lhs;
  char *message;
  error_code eVar2;
  AssertHelper local_210;
  Message local_208;
  error_code local_200;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  unique_lock<mock_mutex> local_118;
  undefined1 local_108 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_c8 [7];
  mock_mutex mutex;
  string_mapping imported_names;
  digest compilation_digest;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> compilation;
  ExchangeCompilation_MissingTriple_Test *this_local;
  
  compilation.field_2._8_8_ = this;
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               "{ \"definitions\": [] }",0x15);
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x9abcdef0;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_c8);
  std::unique_lock<mock_mutex>::unique_lock(&local_118,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_108,
          &(this->super_ExchangeCompilation).import_db_,&local_118);
  std::unique_lock<mock_mutex>::~unique_lock(&local_118);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&compilation_parser.coordinate_,&(this->super_ExchangeCompilation).import_db_,
             true);
  anon_unknown.dwarf_944bc::import_compilation_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_,
             (transaction *)local_108,(string_mapping *)local_c8,
             (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
              *)&compilation_parser.coordinate_,
             (digest *)&imported_names.lookup_._M_h._M_single_bucket);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_,
                       (string *)local_30);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  lhs = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                  ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_);
  eVar2 = pstore::exchange::import_ns::make_error_code(incomplete_compilation_object);
  local_200._M_cat = eVar2._M_cat;
  local_200._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_1f0,"compilation_parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object)",
             lhs,&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  pstore::transaction_base::commit((transaction_base *)local_108);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_);
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)&compilation_parser.coordinate_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_108);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_c8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingTriple) {
    auto const compilation = R"({ "definitions": [] })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}